

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_input(args_t *this,char *str)

{
  int iVar1;
  FILE *pFVar2;
  char *in_RSI;
  long *in_RDI;
  
  if (in_RSI != (char *)0x0) {
    iVar1 = strcmp(in_RSI,"-");
    if (iVar1 != 0) {
      pFVar2 = fopen(in_RSI,"rb");
      *in_RDI = (long)pFVar2;
      goto LAB_0010ef53;
    }
  }
  *in_RDI = _stdin;
LAB_0010ef53:
  if (*in_RDI == 0) {
    ERROR("failed to open the INPUT file %s",in_RSI);
  }
  return;
}

Assistant:

void args_t::parse_input( const char * str )
    {
        if ( str && strcmp( str, "-" ) )
            input = fopen( str, "rb" );
        else
            input = stdin;

        if ( input == NULL )
            ERROR( "failed to open the INPUT file %s", str );
    }